

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# general.c
# Opt level: O0

axbStatus_t axbInit(axbHandle_s **handle)

{
  axbHandle_s *paVar1;
  axbMemBackend_s **ppaVar2;
  axbOpBackend_s **ppaVar3;
  axbHandle_s **handle_local;
  
  paVar1 = (axbHandle_s *)malloc(0x38);
  *handle = paVar1;
  (*handle)->init = 0x67932;
  (*handle)->memBackends_capacity = 10;
  (*handle)->memBackends_size = 0;
  ppaVar2 = (axbMemBackend_s **)malloc((*handle)->memBackends_capacity << 3);
  (*handle)->memBackends = ppaVar2;
  axbMemBackendRegisterDefaults(*handle);
  (*handle)->opBackends_capacity = 10;
  (*handle)->opBackends_size = 0;
  ppaVar3 = (axbOpBackend_s **)malloc((*handle)->opBackends_capacity << 3);
  (*handle)->opBackends = ppaVar3;
  axbOpBackendRegisterDefaults(*handle);
  return 0;
}

Assistant:

axbStatus_t axbInit(struct axbHandle_s **handle)
{
  *handle = malloc(sizeof(struct axbHandle_s));
  (*handle)->init = 424242; // magic number to indicate proper initialization (and track repeated free's)

  (*handle)->memBackends_capacity = 10;
  (*handle)->memBackends_size = 0;
  (*handle)->memBackends = malloc((*handle)->memBackends_capacity * sizeof(struct axbMemBackend_s *));

  axbMemBackendRegisterDefaults(*handle);

  (*handle)->opBackends_capacity = 10;
  (*handle)->opBackends_size = 0;
  (*handle)->opBackends = malloc((*handle)->opBackends_capacity * sizeof(struct axbMemBackend_s *));

  axbOpBackendRegisterDefaults(*handle);

  return 0;
}